

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MakeVerboseFormat.cpp
# Opt level: O3

bool __thiscall
Assimp::MakeVerboseFormatProcess::MakeVerboseFormat(MakeVerboseFormatProcess *this,aiMesh *pcMesh)

{
  vector<aiVertexWeight,std::allocator<aiVertexWeight>> *this_00;
  aiColor4D *paVar1;
  undefined8 *puVar2;
  size_t __n;
  uint uVar3;
  uint uVar4;
  iterator __position;
  aiVector3D *paVar5;
  aiVector3D *paVar6;
  long lVar7;
  undefined8 uVar8;
  aiVertexWeight aVar9;
  float fVar10;
  void *pvVar11;
  aiBone **ppaVar12;
  aiVertexWeight *paVar13;
  uint uVar14;
  aiBone *paVar15;
  uint *puVar16;
  uint i;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  ulong *puVar22;
  aiFace *paVar23;
  vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *this_01;
  vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *__s;
  aiColor4D *apvColorSets [8];
  aiVector3D *apvTextureCoords [8];
  aiVector3D *local_110;
  aiVertexWeight local_100;
  aiVector3D *local_f8;
  aiVector3D *local_f0;
  uint local_e4;
  ulong *local_e0;
  aiVector3D *local_d8;
  ulong local_d0;
  ulong local_c8;
  vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *local_c0;
  long local_b8 [17];
  
  if (pcMesh == (aiMesh *)0x0) {
    __assert_fail("__null != pcMesh",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/PostProcessing/MakeVerboseFormat.cpp"
                  ,0x59,"bool Assimp::MakeVerboseFormatProcess::MakeVerboseFormat(aiMesh *)");
  }
  uVar21 = pcMesh->mNumVertices;
  uVar3 = pcMesh->mNumFaces;
  uVar18 = (ulong)(uVar3 * 3);
  uVar20 = uVar18 * 0xc;
  local_d8 = (aiVector3D *)operator_new__(uVar20);
  if (uVar3 != 0) {
    memset(local_d8,0,((uVar20 - 0xc) / 0xc) * 0xc + 0xc);
  }
  if (uVar21 == 0 || pcMesh->mNormals == (aiVector3D *)0x0) {
    local_f0 = (aiVector3D *)0x0;
  }
  else {
    local_f0 = (aiVector3D *)operator_new__(uVar20);
    if (uVar3 != 0) {
      memset(local_f0,0,((uVar20 - 0xc) / 0xc) * 0xc + 0xc);
    }
  }
  if ((pcMesh->mBitangents == (aiVector3D *)0x0 || pcMesh->mTangents == (aiVector3D *)0x0) ||
      uVar21 == 0) {
    local_f8 = (aiVector3D *)0x0;
    local_b8[0xe] = 0;
    local_b8[0xf] = 0;
    local_b8[0xc] = 0;
    local_b8[0xd] = 0;
    local_b8[10] = 0;
    local_b8[0xb] = 0;
    local_b8[8] = 0;
    local_b8[9] = 0;
    local_b8[6] = 0;
    local_b8[7] = 0;
    local_b8[4] = 0;
    local_b8[5] = 0;
    local_b8[2] = 0;
    local_b8[3] = 0;
    local_b8[0] = 0;
    local_b8[1] = 0;
    local_110 = (aiVector3D *)0x0;
    if (uVar21 == 0) goto LAB_003ab26a;
  }
  else {
    local_f8 = (aiVector3D *)operator_new__(uVar20);
    if (uVar3 == 0) {
      local_110 = (aiVector3D *)operator_new__(uVar20);
    }
    else {
      __n = ((uVar20 - 0xc) / 0xc) * 0xc + 0xc;
      memset(local_f8,0,__n);
      local_110 = (aiVector3D *)operator_new__(uVar20);
      memset(local_110,0,__n);
    }
  }
  local_b8[0xf] = 0;
  local_b8[0xe] = 0;
  local_b8[0xd] = 0;
  local_b8[0xc] = 0;
  local_b8[0xb] = 0;
  local_b8[10] = 0;
  local_b8[9] = 0;
  local_b8[8] = 0;
  local_b8[7] = 0;
  local_b8[6] = 0;
  local_b8[5] = 0;
  local_b8[4] = 0;
  local_b8[3] = 0;
  local_b8[2] = 0;
  local_b8[1] = 0;
  local_b8[0] = 0;
  lVar17 = 0;
  do {
    if (pcMesh->mTextureCoords[lVar17] == (aiVector3D *)0x0) break;
    pvVar11 = operator_new__(uVar20);
    if (uVar3 != 0) {
      memset(pvVar11,0,((uVar20 - 0xc) / 0xc) * 0xc + 0xc);
    }
    local_b8[lVar17 + 8] = (long)pvVar11;
    lVar17 = lVar17 + 1;
  } while (lVar17 != 8);
  if (uVar21 != 0) {
    lVar17 = 0;
    do {
      if (pcMesh->mColors[lVar17] == (aiColor4D *)0x0) break;
      pvVar11 = operator_new__(uVar18 << 4);
      if (uVar3 != 0) {
        memset(pvVar11,0,uVar18 << 4);
      }
      local_b8[lVar17] = (long)pvVar11;
      lVar17 = lVar17 + 1;
    } while (lVar17 != 8);
  }
LAB_003ab26a:
  uVar14 = pcMesh->mNumBones;
  uVar20 = (ulong)uVar14;
  local_e0 = (ulong *)operator_new__(uVar20 * 0x18 + 8);
  *local_e0 = uVar20;
  __s = (vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)(local_e0 + 1);
  local_e4 = uVar21;
  local_d0 = uVar18;
  if (uVar14 == 0) {
    uVar14 = 0;
    uVar21 = uVar3;
  }
  else {
    uVar18 = 0;
    memset(__s,0,((uVar20 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
    this_01 = __s;
    do {
      std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::reserve
                (this_01,(ulong)(pcMesh->mBones[uVar18]->mNumWeights * 3));
      uVar18 = uVar18 + 1;
      uVar14 = pcMesh->mNumBones;
      this_01 = this_01 + 1;
    } while (uVar18 < uVar14);
    uVar21 = pcMesh->mNumFaces;
  }
  uVar20 = (ulong)uVar21;
  if (uVar21 != 0) {
    uVar18 = 0;
    uVar21 = 0;
    local_c0 = __s;
    do {
      if (pcMesh->mFaces[uVar18].mNumIndices != 0) {
        paVar23 = pcMesh->mFaces + uVar18;
        uVar20 = 0;
        local_c8 = uVar18;
        do {
          uVar14 = pcMesh->mNumBones;
          if (uVar14 != 0) {
            ppaVar12 = pcMesh->mBones;
            uVar18 = 0;
            do {
              paVar15 = ppaVar12[uVar18];
              if (paVar15->mNumWeights != 0) {
                this_00 = (vector<aiVertexWeight,std::allocator<aiVertexWeight>> *)(__s + uVar18);
                uVar19 = 0;
                do {
                  if (paVar23->mIndices[uVar20] == paVar15->mWeights[uVar19].mVertexId) {
                    local_100.mWeight = paVar15->mWeights[uVar19].mWeight;
                    __position._M_current = *(aiVertexWeight **)(this_00 + 8);
                    local_100.mVertexId = uVar21;
                    if (__position._M_current == *(aiVertexWeight **)(this_00 + 0x10)) {
                      std::vector<aiVertexWeight,std::allocator<aiVertexWeight>>::
                      _M_realloc_insert<aiVertexWeight_const&>(this_00,__position,&local_100);
                    }
                    else {
                      aVar9.mWeight = local_100.mWeight;
                      aVar9.mVertexId = uVar21;
                      *__position._M_current = aVar9;
                      *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
                    }
                    ppaVar12 = pcMesh->mBones;
                  }
                  uVar19 = uVar19 + 1;
                  paVar15 = ppaVar12[uVar18];
                } while (uVar19 < paVar15->mNumWeights);
                uVar14 = pcMesh->mNumBones;
                __s = local_c0;
              }
              uVar18 = uVar18 + 1;
            } while (uVar18 < uVar14);
          }
          paVar5 = pcMesh->mVertices;
          uVar14 = paVar23->mIndices[uVar20];
          uVar18 = (ulong)uVar21;
          local_d8[uVar18].z = paVar5[uVar14].z;
          paVar5 = paVar5 + uVar14;
          fVar10 = paVar5->y;
          local_d8[uVar18].x = paVar5->x;
          local_d8[uVar18].y = fVar10;
          paVar5 = pcMesh->mNormals;
          uVar4 = pcMesh->mNumVertices;
          if (paVar5 != (aiVector3D *)0x0 && uVar4 != 0) {
            local_f0[uVar18].z = paVar5[uVar14].z;
            fVar10 = paVar5[uVar14].y;
            local_f0[uVar18].x = paVar5[uVar14].x;
            local_f0[uVar18].y = fVar10;
          }
          paVar5 = pcMesh->mTangents;
          paVar6 = pcMesh->mBitangents;
          if ((paVar6 != (aiVector3D *)0x0 && paVar5 != (aiVector3D *)0x0) && uVar4 != 0) {
            local_f8[uVar18].z = paVar5[uVar14].z;
            fVar10 = paVar5[uVar14].y;
            local_f8[uVar18].x = paVar5[uVar14].x;
            local_f8[uVar18].y = fVar10;
            local_110[uVar18].z = paVar6[uVar14].z;
            fVar10 = paVar6[uVar14].y;
            local_110[uVar18].x = paVar6[uVar14].x;
            local_110[uVar18].y = fVar10;
          }
          lVar17 = 0;
          do {
            paVar5 = pcMesh->mTextureCoords[lVar17];
            if ((paVar5 == (aiVector3D *)0x0) || (pcMesh->mNumVertices == 0)) break;
            uVar14 = paVar23->mIndices[uVar20];
            lVar7 = local_b8[lVar17 + 8];
            *(float *)(lVar7 + 8 + uVar18 * 0xc) = paVar5[uVar14].z;
            *(undefined8 *)(lVar7 + uVar18 * 0xc) = *(undefined8 *)(paVar5 + uVar14);
            lVar17 = lVar17 + 1;
          } while (lVar17 != 8);
          lVar17 = 0;
          do {
            puVar16 = paVar23->mIndices;
            if ((pcMesh->mColors[lVar17] == (aiColor4D *)0x0) || (pcMesh->mNumVertices == 0))
            goto LAB_003ab563;
            paVar1 = pcMesh->mColors[lVar17] + puVar16[uVar20];
            uVar8 = *(undefined8 *)&paVar1->b;
            puVar2 = (undefined8 *)(local_b8[lVar17] + uVar18 * 0x10);
            *puVar2 = *(undefined8 *)paVar1;
            puVar2[1] = uVar8;
            lVar17 = lVar17 + 1;
          } while (lVar17 != 8);
          puVar16 = paVar23->mIndices;
LAB_003ab563:
          puVar16[uVar20] = uVar21;
          uVar20 = uVar20 + 1;
          uVar21 = uVar21 + 1;
        } while (uVar20 < paVar23->mNumIndices);
        uVar20 = (ulong)pcMesh->mNumFaces;
        uVar18 = local_c8;
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 < uVar20);
    uVar14 = pcMesh->mNumBones;
  }
  if (uVar14 != 0) {
    puVar22 = local_e0 + 2;
    uVar20 = 0;
    do {
      paVar13 = pcMesh->mBones[uVar20]->mWeights;
      if (paVar13 != (aiVertexWeight *)0x0) {
        operator_delete__(paVar13);
      }
      if (puVar22[-1] == *puVar22) {
        pcMesh->mBones[uVar20]->mWeights = (aiVertexWeight *)0x0;
      }
      else {
        uVar19 = *puVar22 - puVar22[-1];
        uVar18 = 0xffffffffffffffff;
        if (-1 < (long)uVar19) {
          uVar18 = uVar19;
        }
        paVar13 = (aiVertexWeight *)operator_new__(uVar18);
        memset(paVar13,0,(uVar19 - 8 & 0xfffffffffffffff8) + 8);
        pcMesh->mBones[uVar20]->mWeights = paVar13;
        memcpy(pcMesh->mBones[uVar20]->mWeights,(void *)puVar22[-1],*puVar22 - (long)puVar22[-1]);
      }
      uVar20 = uVar20 + 1;
      puVar22 = puVar22 + 3;
    } while (uVar20 < pcMesh->mNumBones);
  }
  puVar22 = local_e0;
  uVar21 = (uint)local_d0;
  if (*local_e0 != 0) {
    lVar17 = *local_e0 * 0x18;
    do {
      pvVar11 = *(void **)((long)puVar22 + lVar17 + -0x10);
      if (pvVar11 != (void *)0x0) {
        operator_delete(pvVar11);
      }
      lVar17 = lVar17 + -0x18;
    } while (lVar17 != 0);
  }
  operator_delete__(puVar22);
  if (pcMesh->mVertices != (aiVector3D *)0x0) {
    operator_delete__(pcMesh->mVertices);
  }
  uVar14 = local_e4;
  pcMesh->mVertices = local_d8;
  lVar17 = 0;
  do {
    if ((pcMesh->mTextureCoords[lVar17] == (aiVector3D *)0x0) || (pcMesh->mNumVertices == 0)) break;
    operator_delete__(pcMesh->mTextureCoords[lVar17]);
    pcMesh->mTextureCoords[lVar17] = (aiVector3D *)local_b8[lVar17 + 8];
    lVar17 = lVar17 + 1;
  } while (lVar17 != 8);
  lVar17 = 0;
  do {
    if ((pcMesh->mColors[lVar17] == (aiColor4D *)0x0) || (pcMesh->mNumVertices == 0)) break;
    operator_delete__(pcMesh->mColors[lVar17]);
    pcMesh->mColors[lVar17] = (aiColor4D *)local_b8[lVar17];
    lVar17 = lVar17 + 1;
  } while (lVar17 != 8);
  pcMesh->mNumVertices = uVar21;
  if (uVar3 != 0 && pcMesh->mNormals != (aiVector3D *)0x0) {
    operator_delete__(pcMesh->mNormals);
    pcMesh->mNormals = local_f0;
    uVar21 = pcMesh->mNumVertices;
  }
  if ((pcMesh->mTangents != (aiVector3D *)0x0) && (pcMesh->mBitangents != (aiVector3D *)0x0)) {
    if (uVar21 == 0) {
      uVar21 = 0;
    }
    else {
      operator_delete__(pcMesh->mTangents);
      pcMesh->mTangents = local_f8;
      if (pcMesh->mBitangents != (aiVector3D *)0x0) {
        operator_delete__(pcMesh->mBitangents);
      }
      pcMesh->mBitangents = local_110;
      uVar21 = pcMesh->mNumVertices;
    }
  }
  return uVar21 != uVar14;
}

Assistant:

bool MakeVerboseFormatProcess::MakeVerboseFormat(aiMesh* pcMesh)
{
    ai_assert(NULL != pcMesh);

    unsigned int iOldNumVertices = pcMesh->mNumVertices;
    const unsigned int iNumVerts = pcMesh->mNumFaces*3;

    aiVector3D* pvPositions = new aiVector3D[ iNumVerts ];

    aiVector3D* pvNormals = NULL;
    if (pcMesh->HasNormals())
    {
        pvNormals = new aiVector3D[iNumVerts];
    }
    aiVector3D* pvTangents = NULL, *pvBitangents = NULL;
    if (pcMesh->HasTangentsAndBitangents())
    {
        pvTangents = new aiVector3D[iNumVerts];
        pvBitangents = new aiVector3D[iNumVerts];
    }

    aiVector3D* apvTextureCoords[AI_MAX_NUMBER_OF_TEXTURECOORDS] = {0};
    aiColor4D* apvColorSets[AI_MAX_NUMBER_OF_COLOR_SETS] = {0};

    unsigned int p = 0;
    while (pcMesh->HasTextureCoords(p))
        apvTextureCoords[p++] = new aiVector3D[iNumVerts];

    p = 0;
    while (pcMesh->HasVertexColors(p))
        apvColorSets[p++] = new aiColor4D[iNumVerts];

    // allocate enough memory to hold output bones and vertex weights ...
    std::vector<aiVertexWeight>* newWeights = new std::vector<aiVertexWeight>[pcMesh->mNumBones];
    for (unsigned int i = 0;i < pcMesh->mNumBones;++i) {
        newWeights[i].reserve(pcMesh->mBones[i]->mNumWeights*3);
    }

    // iterate through all faces and build a clean list
    unsigned int iIndex = 0;
    for (unsigned int a = 0; a< pcMesh->mNumFaces;++a)
    {
        aiFace* pcFace = &pcMesh->mFaces[a];
        for (unsigned int q = 0; q < pcFace->mNumIndices;++q,++iIndex)
        {
            // need to build a clean list of bones, too
            for (unsigned int i = 0;i < pcMesh->mNumBones;++i)
            {
                for (unsigned int a = 0;  a < pcMesh->mBones[i]->mNumWeights;a++)
                {
                    const aiVertexWeight& w = pcMesh->mBones[i]->mWeights[a];
                    if(pcFace->mIndices[q] == w.mVertexId)
                    {
                        aiVertexWeight wNew;
                        wNew.mVertexId = iIndex;
                        wNew.mWeight = w.mWeight;
                        newWeights[i].push_back(wNew);
                    }
                }
            }

            pvPositions[iIndex] = pcMesh->mVertices[pcFace->mIndices[q]];

            if (pcMesh->HasNormals())
            {
                pvNormals[iIndex] = pcMesh->mNormals[pcFace->mIndices[q]];
            }
            if (pcMesh->HasTangentsAndBitangents())
            {
                pvTangents[iIndex] = pcMesh->mTangents[pcFace->mIndices[q]];
                pvBitangents[iIndex] = pcMesh->mBitangents[pcFace->mIndices[q]];
            }

            unsigned int p = 0;
            while (pcMesh->HasTextureCoords(p))
            {
                apvTextureCoords[p][iIndex] = pcMesh->mTextureCoords[p][pcFace->mIndices[q]];
                ++p;
            }
            p = 0;
            while (pcMesh->HasVertexColors(p))
            {
                apvColorSets[p][iIndex] = pcMesh->mColors[p][pcFace->mIndices[q]];
                ++p;
            }
            pcFace->mIndices[q] = iIndex;
        }
    }



    // build output vertex weights
    for (unsigned int i = 0;i < pcMesh->mNumBones;++i)
    {
        delete [] pcMesh->mBones[i]->mWeights;
        if (!newWeights[i].empty()) {
            pcMesh->mBones[i]->mWeights = new aiVertexWeight[newWeights[i].size()];
            aiVertexWeight *weightToCopy = &( newWeights[i][0] );
            memcpy(pcMesh->mBones[i]->mWeights, weightToCopy,
                sizeof(aiVertexWeight) * newWeights[i].size());
        } else {
            pcMesh->mBones[i]->mWeights = NULL;
        }
    }
    delete[] newWeights;

    // delete the old members
    delete[] pcMesh->mVertices;
    pcMesh->mVertices = pvPositions;

    p = 0;
    while (pcMesh->HasTextureCoords(p))
    {
        delete[] pcMesh->mTextureCoords[p];
        pcMesh->mTextureCoords[p] = apvTextureCoords[p];
        ++p;
    }
    p = 0;
    while (pcMesh->HasVertexColors(p))
    {
        delete[] pcMesh->mColors[p];
        pcMesh->mColors[p] = apvColorSets[p];
        ++p;
    }
    pcMesh->mNumVertices = iNumVerts;

    if (pcMesh->HasNormals())
    {
        delete[] pcMesh->mNormals;
        pcMesh->mNormals = pvNormals;
    }
    if (pcMesh->HasTangentsAndBitangents())
    {
        delete[] pcMesh->mTangents;
        pcMesh->mTangents = pvTangents;
        delete[] pcMesh->mBitangents;
        pcMesh->mBitangents = pvBitangents;
    }
    return (pcMesh->mNumVertices != iOldNumVertices);
}